

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GRULayerParams::InternalSwap(GRULayerParams *this,GRULayerParams *other)

{
  bool bVar1;
  int iVar2;
  WeightParams *pWVar3;
  uint64 uVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(other->activations_).super_RepeatedPtrFieldBase);
  pWVar3 = this->updategateweightmatrix_;
  this->updategateweightmatrix_ = other->updategateweightmatrix_;
  other->updategateweightmatrix_ = pWVar3;
  pWVar3 = this->resetgateweightmatrix_;
  this->resetgateweightmatrix_ = other->resetgateweightmatrix_;
  other->resetgateweightmatrix_ = pWVar3;
  pWVar3 = this->outputgateweightmatrix_;
  this->outputgateweightmatrix_ = other->outputgateweightmatrix_;
  other->outputgateweightmatrix_ = pWVar3;
  pWVar3 = this->updategaterecursionmatrix_;
  this->updategaterecursionmatrix_ = other->updategaterecursionmatrix_;
  other->updategaterecursionmatrix_ = pWVar3;
  pWVar3 = this->resetgaterecursionmatrix_;
  this->resetgaterecursionmatrix_ = other->resetgaterecursionmatrix_;
  other->resetgaterecursionmatrix_ = pWVar3;
  pWVar3 = this->outputgaterecursionmatrix_;
  this->outputgaterecursionmatrix_ = other->outputgaterecursionmatrix_;
  other->outputgaterecursionmatrix_ = pWVar3;
  pWVar3 = this->updategatebiasvector_;
  this->updategatebiasvector_ = other->updategatebiasvector_;
  other->updategatebiasvector_ = pWVar3;
  pWVar3 = this->resetgatebiasvector_;
  this->resetgatebiasvector_ = other->resetgatebiasvector_;
  other->resetgatebiasvector_ = pWVar3;
  pWVar3 = this->outputgatebiasvector_;
  this->outputgatebiasvector_ = other->outputgatebiasvector_;
  other->outputgatebiasvector_ = pWVar3;
  uVar4 = this->inputvectorsize_;
  this->inputvectorsize_ = other->inputvectorsize_;
  other->inputvectorsize_ = uVar4;
  uVar4 = this->outputvectorsize_;
  this->outputvectorsize_ = other->outputvectorsize_;
  other->outputvectorsize_ = uVar4;
  bVar1 = this->sequenceoutput_;
  this->sequenceoutput_ = other->sequenceoutput_;
  other->sequenceoutput_ = bVar1;
  bVar1 = this->hasbiasvectors_;
  this->hasbiasvectors_ = other->hasbiasvectors_;
  other->hasbiasvectors_ = bVar1;
  bVar1 = this->reverseinput_;
  this->reverseinput_ = other->reverseinput_;
  other->reverseinput_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void GRULayerParams::InternalSwap(GRULayerParams* other) {
  activations_.InternalSwap(&other->activations_);
  std::swap(updategateweightmatrix_, other->updategateweightmatrix_);
  std::swap(resetgateweightmatrix_, other->resetgateweightmatrix_);
  std::swap(outputgateweightmatrix_, other->outputgateweightmatrix_);
  std::swap(updategaterecursionmatrix_, other->updategaterecursionmatrix_);
  std::swap(resetgaterecursionmatrix_, other->resetgaterecursionmatrix_);
  std::swap(outputgaterecursionmatrix_, other->outputgaterecursionmatrix_);
  std::swap(updategatebiasvector_, other->updategatebiasvector_);
  std::swap(resetgatebiasvector_, other->resetgatebiasvector_);
  std::swap(outputgatebiasvector_, other->outputgatebiasvector_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(sequenceoutput_, other->sequenceoutput_);
  std::swap(hasbiasvectors_, other->hasbiasvectors_);
  std::swap(reverseinput_, other->reverseinput_);
  std::swap(_cached_size_, other->_cached_size_);
}